

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

int getNumDefendingDice(Country *toCountry,Player *player)

{
  __type _Var1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  PlayerStrategy *pPVar6;
  ulong uVar7;
  __type local_2d;
  int numDefendingDice;
  Player *player_local;
  Country *toCountry_local;
  
  do {
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    poVar5 = std::operator<<((ostream *)&std::cout,"\n[DEFENDER] How many dice will Player ");
    iVar3 = Map::Country::getPlayerOwnerID(toCountry);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
    std::operator<<(poVar5," roll?(1 to ");
    iVar3 = Map::Country::getNumberOfTroops(toCountry);
    if (iVar3 < 2) {
      std::operator<<((ostream *)&std::cout,"1)");
    }
    else {
      std::operator<<((ostream *)&std::cout,"2)");
    }
    pPVar6 = Player::getStrategy(player);
    iVar3 = (*pPVar6->_vptr_PlayerStrategy[1])();
    if ((((iVar3 < 1) || (2 < iVar3)) ||
        (iVar4 = Map::Country::getNumberOfTroops(toCountry), iVar4 < iVar3)) ||
       ((uVar7 = std::ios::fail(), (uVar7 & 1) != 0 || (_Var1 = std::isnan<int>(iVar3), _Var1)))) {
      std::operator<<((ostream *)&std::cout,"\nInvalid Input. Please try again.\n");
    }
    local_2d = true;
    if ((0 < iVar3) && (local_2d = true, iVar3 < 3)) {
      iVar4 = Map::Country::getNumberOfTroops(toCountry);
      local_2d = true;
      if (iVar3 <= iVar4) {
        bVar2 = std::ios::fail();
        local_2d = true;
        if ((bVar2 & 1) == 0) {
          local_2d = std::isnan<int>(iVar3);
        }
      }
    }
  } while (local_2d != false);
  return iVar3;
}

Assistant:

static int getNumDefendingDice(Map::Country *toCountry, Player *player) {

    int numDefendingDice = 0;
    do {
        std::cin.clear();
        std::cout << "\n[DEFENDER] How many dice will Player " << toCountry->getPlayerOwnerID() << " roll?(1 to ";
        if (toCountry->getNumberOfTroops() >= 2) {
            std::cout << "2)";
        } else {
            std::cout << "1)";
        }
        numDefendingDice = player->getStrategy()->intInput(StrategyContext::DEFEND_DICE_COUNT);
        if (numDefendingDice < 1 || numDefendingDice > 2 || numDefendingDice > toCountry->getNumberOfTroops() ||
            cin.fail() || isnan(numDefendingDice)) {
            std::cout << "\nInvalid Input. Please try again.\n";
            continue;
        }
    } while (numDefendingDice < 1 || numDefendingDice > 2 || numDefendingDice > toCountry->getNumberOfTroops() ||
             cin.fail() || isnan(numDefendingDice));
    return numDefendingDice;
}